

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O1

bool __thiscall
cmArgumentParser<(anonymous_namespace)::Result>::
Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
          (cmArgumentParser<(anonymous_namespace)::Result> *this,Result *result,
          initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *args,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *unparsedArguments,size_t pos)

{
  _Manager_type p_Var1;
  Instance instance;
  Instance local_70;
  
  local_70.Bindings = (ActionMap *)(anonymous_namespace)::parserStatic;
  local_70.Keyword._M_len = 0;
  local_70.Keyword._M_str = (char *)0x0;
  local_70.KeywordValuesSeen = 0;
  local_70.KeywordValuesExpected = 0;
  local_70.KeywordValueFunc.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_70.KeywordValueFunc.super__Function_base._M_functor._8_8_ = 0;
  local_70.KeywordValueFunc.super__Function_base._M_manager = (_Manager_type)0x0;
  local_70.KeywordValueFunc._M_invoker = (_Invoker_type)0x0;
  local_70.DoneWithPositional = false;
  local_70.ParseResults = (ParseResult *)this;
  local_70.UnparsedArguments =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)result;
  local_70.Result = this;
  ArgumentParser::Instance::
  Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
            (&local_70,
             (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             (anonymous_namespace)::args,0);
  p_Var1 = (this->super_Base).Bindings.KeywordMissingValue.super__Function_base._M_manager;
  if (local_70.KeywordValueFunc.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_70.KeywordValueFunc.super__Function_base._M_manager)
              ((_Any_data *)&local_70.KeywordValueFunc,(_Any_data *)&local_70.KeywordValueFunc,
               __destroy_functor);
  }
  return p_Var1 == (_Manager_type)0x0;
}

Assistant:

bool Parse(Result& result, Range const& args,
             std::vector<std::string>* unparsedArguments,
             std::size_t pos = 0) const
  {
    using ArgumentParser::AsParseResultPtr;
    ParseResult* parseResultPtr = AsParseResultPtr(result);
    Instance instance(this->Bindings, parseResultPtr, unparsedArguments,
                      &result);
    instance.Parse(args, pos);
    return parseResultPtr ? static_cast<bool>(*parseResultPtr) : true;
  }